

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzadmchunk.h
# Opt level: O2

void __thiscall
TPZAdmChunkVector<TPZCompEl_*,_10>::SetFree(TPZAdmChunkVector<TPZCompEl_*,_10> *this,int index)

{
  int *piVar1;
  ostream *poVar2;
  
  if (index < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TPZAdmChunkVector::SetFree. Bad parameter index.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ostream::flush();
    return;
  }
  piVar1 = (this->fNFree).super_TPZVec<int>.fStore + ((uint)index >> 10);
  *piVar1 = *piVar1 + 1;
  TPZStack<int,_10>::Push(&this->fFree,index);
  if (this->fCompactScheme == ALWAYS) {
    CompactDataStructure(this,ALWAYS);
    return;
  }
  return;
}

Assistant:

void TPZAdmChunkVector<T, EXP>::SetFree(int index) {
#ifndef PZNODEBUG
    if (index < 0) {
        PZError << "TPZAdmChunkVector::SetFree. Bad parameter index." << std::endl;
        PZError.flush();
        return;
    }
#endif

    int chunk = index >> EXP;

    fNFree[chunk]++;
    fFree.Push(index);

    if (fCompactScheme == ALWAYS) {
        CompactDataStructure(ALWAYS);
}
}